

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O2

parse_node * __thiscall
ORPG::ExpressionTree::new_number(ExpressionTree *this,parse_node *curr,int *numBytesToRead)

{
  int iVar1;
  parse_node *ppVar2;
  parse_node *ppVar3;
  ExpressionTree *pEVar4;
  int numBytesRead;
  string currParseString;
  
  std::__cxx11::string::string((string *)&currParseString,"",(allocator *)&numBytesRead);
  numBytesRead = 0;
  pEVar4 = this;
  parse_input_string(this,&currParseString,&numBytesRead,*numBytesToRead);
  if (curr->left == (parse_node *)0x0) {
    ppVar2 = allocate_node(pEVar4);
    curr->left = ppVar2;
  }
  else {
    ppVar2 = curr;
    if (curr->right != (parse_node *)0x0) goto LAB_00103644;
    ppVar2 = allocate_node(pEVar4);
    curr->right = ppVar2;
  }
  ppVar2->parent = curr;
LAB_00103644:
  pEVar4 = (ExpressionTree *)&currParseString;
  iVar1 = std::__cxx11::stoi((string *)pEVar4,(size_t *)0x0,10);
  ppVar2->value = iVar1;
  ppVar2->op = 1;
  ppVar3 = ppVar2->parent;
  if (ppVar3 == (parse_node *)0x0) {
    if ((this->inputString)._M_string_length == (long)numBytesRead) {
      ppVar3 = (parse_node *)0x0;
    }
    else {
      ppVar3 = allocate_node(pEVar4);
      ppVar2->parent = ppVar3;
      ppVar3->left = ppVar2;
    }
  }
  *numBytesToRead = 0;
  std::__cxx11::string::~string((string *)&currParseString);
  return ppVar3;
}

Assistant:

struct parse_node* ExpressionTree::new_number(struct parse_node* curr, int
                            * numBytesToRead) {
        string currParseString = "";
        int numBytesRead = 0;

        parse_input_string(&currParseString, &numBytesRead, *numBytesToRead);

        if(!curr->left) {
            curr->left = allocate_node();
            curr->left->parent = curr;
            curr = curr->left;
        } else if(!curr->right) {
            curr->right = allocate_node();
            curr->right->parent = curr;
            curr = curr->right;
        }
                
        curr->value = stoi(currParseString);
        curr->op = OP_NUMBER;


        if(curr->parent == NULL && (size_t)numBytesRead != inputString.length()) {
            curr->parent = allocate_node();
            curr->parent->left = curr;
        }
            
        curr = curr->parent;

        *numBytesToRead = 0;
        
        return curr;
    }